

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

void Ssc_GiaResetSimInfo(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(p->vSimsPi);
  iVar2 = Gia_ManCiNum(p);
  if (iVar1 % iVar2 == 0) {
    if (p->vSims == (Vec_Wrd_t *)0x0) {
      pVVar3 = Vec_WrdAlloc(0);
      p->vSims = pVVar3;
    }
    pVVar3 = p->vSims;
    iVar1 = Gia_ObjSimWords(p);
    iVar2 = Gia_ManObjNum(p);
    Vec_WrdFill(pVVar3,iVar1 * iVar2,0);
    return;
  }
  __assert_fail("Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                ,0xf2,"void Ssc_GiaResetSimInfo(Gia_Man_t *)");
}

Assistant:

void Ssc_GiaResetSimInfo( Gia_Man_t * p )
{
    assert( Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0 );
    if ( p->vSims == NULL )
        p->vSims = Vec_WrdAlloc(0);
    Vec_WrdFill( p->vSims, Gia_ObjSimWords(p) * Gia_ManObjNum(p), 0 );
}